

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O1

void __thiscall calculator::Function::~Function(Function *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Word).super_Token._vptr_Token = (_func_int **)&PTR__Word_001184a8;
  pcVar2 = (this->super_Word).__lexeme._M_dataplus._M_p;
  paVar1 = &(this->super_Word).__lexeme.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_Word).super_Token._vptr_Token = (_func_int **)&PTR__Token_00118510;
  std::
  _Hashtable<calculator::Tag,_std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<calculator::Tag>,_std::hash<calculator::Tag>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->super_Word).super_Token.tagTable._M_h);
  operator_delete(this,0x70);
  return;
}

Assistant:

Function(const std::string& name, bool minus = false)
        : Word(name, minus, Tag::Function) {}